

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode Curl_auth_decode_ntlm_type2_message(Curl_easy *data,char *type2msg,ntlmdata *ntlm)

{
  uint uVar1;
  size_t sVar2;
  size_t local_40;
  size_t type2_len;
  uchar *type2;
  ntlmdata *pnStack_28;
  CURLcode result;
  ntlmdata *ntlm_local;
  char *type2msg_local;
  Curl_easy *data_local;
  
  type2._4_4_ = CURLE_OK;
  type2_len = 0;
  local_40 = 0;
  pnStack_28 = ntlm;
  ntlm_local = (ntlmdata *)type2msg;
  type2msg_local = (char *)data;
  sVar2 = strlen(type2msg);
  if (((sVar2 == 0) || ((char)ntlm_local->state == 0x3d)) ||
     (type2._4_4_ = Curl_base64_decode((char *)ntlm_local,(uchar **)&type2_len,&local_40),
     data_local._4_4_ = type2._4_4_, type2._4_4_ == CURLE_OK)) {
    if (type2_len == 0) {
      Curl_infof((Curl_easy *)type2msg_local,"NTLM handshake failure (empty type-2 message)\n");
      data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
    else {
      pnStack_28->flags = 0;
      if (((local_40 < 0x20) || (*(long *)type2_len != 0x5053534d4c544e)) ||
         (*(int *)(type2_len + 8) != 2)) {
        (*Curl_cfree)((void *)type2_len);
        Curl_infof((Curl_easy *)type2msg_local,"NTLM handshake failure (bad type-2 message)\n");
        data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        uVar1 = Curl_read32_le((uchar *)(type2_len + 0x14));
        pnStack_28->flags = uVar1;
        *(undefined8 *)pnStack_28->nonce = *(undefined8 *)(type2_len + 0x18);
        if (((pnStack_28->flags & 0x800000) == 0) ||
           (type2._4_4_ = ntlm_decode_type2_target
                                    ((Curl_easy *)type2msg_local,(uchar *)type2_len,local_40,
                                     pnStack_28), type2._4_4_ == CURLE_OK)) {
          (*Curl_cfree)((void *)type2_len);
          data_local._4_4_ = type2._4_4_;
        }
        else {
          (*Curl_cfree)((void *)type2_len);
          Curl_infof((Curl_easy *)type2msg_local,"NTLM handshake failure (bad type-2 message)\n");
          data_local._4_4_ = type2._4_4_;
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_decode_ntlm_type2_message(struct Curl_easy *data,
                                             const char *type2msg,
                                             struct ntlmdata *ntlm)
{
  static const char type2_marker[] = { 0x02, 0x00, 0x00, 0x00 };

  /* NTLM type-2 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x02000000)
           12    Target Name            security buffer
           20    Flags                  long
           24    Challenge              8 bytes
          (32)   Context                8 bytes (two consecutive longs) (*)
          (40)   Target Information     security buffer (*)
          (48)   OS Version Structure   8 bytes (*)
  32 (48) (56)   Start of data block    (*)
                                        (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  unsigned char *type2 = NULL;
  size_t type2_len = 0;

#if defined(NTLM_NEEDS_NSS_INIT)
  /* Make sure the crypto backend is initialized */
  result = Curl_nss_force_init(data);
  if(result)
    return result;
#elif defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)data;
#endif

  /* Decode the base-64 encoded type-2 message */
  if(strlen(type2msg) && *type2msg != '=') {
    result = Curl_base64_decode(type2msg, &type2, &type2_len);
    if(result)
      return result;
  }

  /* Ensure we have a valid type-2 message */
  if(!type2) {
    infof(data, "NTLM handshake failure (empty type-2 message)\n");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = 0;

  if((type2_len < 32) ||
     (memcmp(type2, NTLMSSP_SIGNATURE, 8) != 0) ||
     (memcmp(type2 + 8, type2_marker, sizeof(type2_marker)) != 0)) {
    /* This was not a good enough type-2 message */
    free(type2);
    infof(data, "NTLM handshake failure (bad type-2 message)\n");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = Curl_read32_le(&type2[20]);
  memcpy(ntlm->nonce, &type2[24], 8);

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_TARGET_INFO) {
    result = ntlm_decode_type2_target(data, type2, type2_len, ntlm);
    if(result) {
      free(type2);
      infof(data, "NTLM handshake failure (bad type-2 message)\n");
      return result;
    }
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE2 header flags=0x%08.8lx ", ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n                  nonce=");
    ntlm_print_hex(stderr, (char *)ntlm->nonce, 8);
    fprintf(stderr, "\n****\n");
    fprintf(stderr, "**** Header %s\n ", header);
  });

  free(type2);

  return result;
}